

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ReflectionOpsTest_FindForeignInitializationErrors_Test::
TestBody(ReflectionOpsTest_FindForeignInitializationErrors_Test *this)

{
  bool bVar1;
  char *message_00;
  Message *message_01;
  AssertHelper local_a8;
  Message local_a0;
  string local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  undefined1 local_58 [8];
  TestRequiredForeign message;
  ReflectionOpsTest_FindForeignInitializationErrors_Test *this_local;
  
  message.field_0._48_8_ = this;
  proto2_unittest::TestRequiredForeign::TestRequiredForeign((TestRequiredForeign *)local_58);
  proto2_unittest::TestRequiredForeign::mutable_optional_message((TestRequiredForeign *)local_58);
  proto2_unittest::TestRequiredForeign::add_repeated_message((TestRequiredForeign *)local_58);
  proto2_unittest::TestRequiredForeign::add_repeated_message((TestRequiredForeign *)local_58);
  internal::(anonymous_namespace)::FindInitializationErrors_abi_cxx11_
            (&local_98,(_anonymous_namespace_ *)local_58,message_01);
  testing::internal::EqHelper::
  Compare<char[189],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_78,
             "\"optional_message.a,\" \"optional_message.b,\" \"optional_message.c,\" \"repeated_message[0].a,\" \"repeated_message[0].b,\" \"repeated_message[0].c,\" \"repeated_message[1].a,\" \"repeated_message[1].b,\" \"repeated_message[1].c\""
             ,"FindInitializationErrors(message)",
             (char (*) [189])
             "optional_message.a,optional_message.b,optional_message.c,repeated_message[0].a,repeated_message[0].b,repeated_message[0].c,repeated_message[1].a,repeated_message[1].b,repeated_message[1].c"
             ,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops_unittest.cc"
               ,0x1d6,message_00);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  proto2_unittest::TestRequiredForeign::~TestRequiredForeign((TestRequiredForeign *)local_58);
  return;
}

Assistant:

TEST(ReflectionOpsTest, FindForeignInitializationErrors) {
  unittest::TestRequiredForeign message;
  message.mutable_optional_message();
  message.add_repeated_message();
  message.add_repeated_message();
  EXPECT_EQ(
      "optional_message.a,"
      "optional_message.b,"
      "optional_message.c,"
      "repeated_message[0].a,"
      "repeated_message[0].b,"
      "repeated_message[0].c,"
      "repeated_message[1].a,"
      "repeated_message[1].b,"
      "repeated_message[1].c",
      FindInitializationErrors(message));
}